

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool (anonymous_namespace)::miniz::mz_zip_reader_read_central_dir
                  (mz_zip_archive *pZip,mz_uint32 flags)

{
  uint uVar1;
  uint uVar2;
  mz_bool mVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint in_ESI;
  ulong *in_RDI;
  bool bVar7;
  mz_uint disk_index;
  mz_uint decomp_size;
  mz_uint comp_size;
  mz_uint total_header_size;
  mz_uint n_1;
  mz_uint i_1;
  int n;
  int i;
  mz_bool sort_central_dir;
  mz_uint8 *pBuf;
  mz_uint32 buf_u32 [1024];
  mz_uint8 *p;
  mz_int64 cur_file_ofs;
  mz_uint64 cdir_ofs;
  mz_uint cdir_disk_index;
  mz_uint num_this_disk;
  mz_uint cdir_size;
  long local_10e0;
  ulong local_10d8;
  long lVar8;
  mz_uint growing;
  undefined4 in_stack_ffffffffffffef38;
  undefined4 in_stack_ffffffffffffef3c;
  undefined4 in_stack_ffffffffffffef40;
  undefined4 in_stack_ffffffffffffef44;
  undefined4 in_stack_ffffffffffffef48;
  undefined4 in_stack_ffffffffffffef4c;
  uint local_10b0;
  int local_10a8;
  mz_zip_archive *pZip_00;
  mz_zip_archive local_1098 [42];
  int *local_98;
  long local_90;
  ulong local_88;
  uint local_80;
  uint local_7c;
  uint local_78;
  ulong *local_70;
  undefined4 local_64;
  ulong local_60;
  long local_58;
  ulong *local_50;
  int local_48;
  undefined4 local_44;
  ulong local_40;
  long local_38;
  ulong *local_30;
  int local_28;
  undefined4 local_24;
  ulong local_20;
  ulong local_18;
  ulong *local_10;
  int local_4;
  
  pZip_00 = local_1098;
  bVar7 = (in_ESI & 0x800) == 0;
  if (*in_RDI < 0x16) {
    return 0;
  }
  local_70 = in_RDI;
  if ((long)(*in_RDI - 0x1000) < 1) {
    local_90 = 0;
    lVar8 = local_90;
  }
  else {
    local_90 = *in_RDI - 0x1000;
    lVar8 = local_90;
  }
  while( true ) {
    if (*local_70 - local_90 < 0x1001) {
      local_10d8 = *local_70 - local_90;
    }
    else {
      local_10d8 = 0x1000;
    }
    uVar5 = (*(code *)local_70[8])(local_70[10],local_90,pZip_00,(long)(int)local_10d8);
    if (uVar5 != (local_10d8 & 0xffffffff)) {
      return 0;
    }
    local_10a8 = (int)local_10d8 + -4;
    while ((-1 < local_10a8 &&
           (CONCAT13(*(undefined1 *)((long)&pZip_00->m_archive_size + (long)local_10a8 + 3),
                     CONCAT12(*(undefined1 *)((long)&pZip_00->m_archive_size + (long)local_10a8 + 2)
                              ,CONCAT11(*(undefined1 *)
                                         ((long)&pZip_00->m_archive_size + (long)local_10a8 + 1),
                                        *(undefined1 *)
                                         ((long)&pZip_00->m_archive_size + (long)local_10a8)))) !=
            0x6054b50))) {
      local_10a8 = local_10a8 + -1;
    }
    if (-1 < local_10a8) break;
    if (local_90 == 0) {
      return 0;
    }
    if (0x10014 < *local_70 - local_90) {
      return 0;
    }
    if (local_90 == 0xffd) {
      local_10e0 = 0;
    }
    else {
      local_10e0 = local_90 + -0xffd;
    }
    local_90 = local_10e0;
  }
  local_90 = local_10a8 + local_90;
  lVar6 = (*(code *)local_70[8])(local_70[10],local_90,pZip_00,0x16);
  if (lVar6 != 0x16) {
    return 0;
  }
  if (((int)pZip_00->m_archive_size != 0x6054b50) ||
     (uVar2 = (uint)*(ushort *)((long)&pZip_00->m_central_directory_file_ofs + 2),
     *(uint *)(local_70 + 2) = uVar2, uVar2 != (ushort)pZip_00->m_central_directory_file_ofs)) {
    return 0;
  }
  local_7c = (uint)*(ushort *)((long)&pZip_00->m_archive_size + 4);
  local_80 = (uint)*(ushort *)((long)&pZip_00->m_archive_size + 6);
  if ((local_7c != 0 || local_80 != 0) && ((local_7c != 1 || (local_80 != 1)))) {
    return 0;
  }
  local_78 = *(uint *)((long)&pZip_00->m_central_directory_file_ofs + 4);
  if (local_78 < (uint)((int)local_70[2] * 0x2e)) {
    return 0;
  }
  local_88 = (ulong)pZip_00->m_total_files;
  if (*local_70 < local_88 + local_78) {
    return 0;
  }
  local_70[1] = local_88;
  if ((int)local_70[2] != 0) {
    local_18 = local_70[0xb];
    local_20 = (ulong)local_78;
    local_10 = local_70;
    local_24 = 0;
    growing = (mz_uint)((ulong)lVar8 >> 0x20);
    if ((*(ulong *)(local_18 + 0x10) < local_20) &&
       (mVar3 = mz_zip_array_ensure_capacity
                          ((mz_zip_archive *)
                           CONCAT44(in_stack_ffffffffffffef4c,in_stack_ffffffffffffef48),
                           (mz_zip_array *)
                           CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                           CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38),growing),
       mVar3 == 0)) {
      local_4 = 0;
    }
    else {
      *(ulong *)(local_18 + 8) = local_20;
      local_4 = 1;
    }
    if (local_4 != 0) {
      local_38 = local_70[0xb] + 0x20;
      local_40 = (ulong)(uint)local_70[2];
      local_30 = local_70;
      local_44 = 0;
      if ((*(ulong *)(local_70[0xb] + 0x30) < local_40) &&
         (mVar3 = mz_zip_array_ensure_capacity
                            ((mz_zip_archive *)
                             CONCAT44(in_stack_ffffffffffffef4c,in_stack_ffffffffffffef48),
                             (mz_zip_array *)
                             CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                             CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38),growing),
         mVar3 == 0)) {
        local_28 = 0;
      }
      else {
        *(ulong *)(local_38 + 8) = local_40;
        local_28 = 1;
      }
      if (local_28 != 0) {
        if (bVar7) {
          local_58 = local_70[0xb] + 0x40;
          local_60 = (ulong)(uint)local_70[2];
          local_50 = local_70;
          local_64 = 0;
          if ((*(ulong *)(local_70[0xb] + 0x50) < local_60) &&
             (mVar3 = mz_zip_array_ensure_capacity
                                ((mz_zip_archive *)
                                 CONCAT44(in_stack_ffffffffffffef4c,in_stack_ffffffffffffef48),
                                 (mz_zip_array *)
                                 CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                                 CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38),
                                 growing), mVar3 == 0)) {
            local_48 = 0;
          }
          else {
            *(ulong *)(local_58 + 8) = local_60;
            local_48 = 1;
          }
          if (local_48 == 0) {
            return 0;
          }
        }
        uVar5 = (*(code *)local_70[8])(local_70[10],local_88,*(undefined8 *)local_70[0xb],local_78);
        if (uVar5 != local_78) {
          return 0;
        }
        local_98 = *(int **)local_70[0xb];
        uVar2 = local_78;
        for (local_10b0 = 0; local_10b0 < (uint)local_70[2]; local_10b0 = local_10b0 + 1) {
          if ((uVar2 < 0x2e) || (*local_98 != 0x2014b50)) {
            return 0;
          }
          *(int *)(*(long *)(local_70[0xb] + 0x20) + (ulong)local_10b0 * 4) =
               (int)local_98 - (int)*(undefined8 *)local_70[0xb];
          if (bVar7) {
            *(uint *)(*(long *)(local_70[0xb] + 0x40) + (ulong)local_10b0 * 4) = local_10b0;
          }
          uVar4 = local_98[5];
          uVar1 = local_98[6];
          if ((((*(int *)((long)local_98 + 10) == 0) && (uVar1 != uVar4)) ||
              ((uVar1 != 0 && (uVar4 == 0)))) || ((uVar1 == 0xffffffff || (uVar4 == 0xffffffff)))) {
            return 0;
          }
          if ((*(ushort *)((long)local_98 + 0x22) != local_7c) &&
             (*(ushort *)((long)local_98 + 0x22) != 1)) {
            return 0;
          }
          if (*local_70 < (ulong)*(uint *)((long)local_98 + 0x2a) + 0x1e + (ulong)uVar4) {
            return 0;
          }
          uVar4 = *(ushort *)(local_98 + 7) + 0x2e + (uint)*(ushort *)((long)local_98 + 0x1e) +
                  (uint)*(ushort *)(local_98 + 8);
          if (uVar2 < uVar4) {
            return 0;
          }
          uVar2 = uVar2 - uVar4;
          local_98 = (int *)((long)local_98 + (ulong)uVar4);
        }
        goto LAB_001da130;
      }
    }
    return 0;
  }
LAB_001da130:
  if (bVar7) {
    mz_zip_reader_sort_central_dir_offsets_by_filename(pZip_00);
  }
  return 1;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,
                                              mz_uint32 flags) {
  mz_uint cdir_size, num_this_disk, cdir_disk_index;
  mz_uint64 cdir_ofs;
  mz_int64 cur_file_ofs;
  const mz_uint8 *p;
  mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
  mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
  mz_bool sort_central_dir =
      ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
  // Basic sanity checks - reject files which are too small, and check the first
  // 4 bytes of the file to make sure a local header is there.
  if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  // Find the end of central directory record by scanning the file from the end
  // towards the beginning.
  cur_file_ofs =
      MZ_MAX((mz_int64)pZip->m_archive_size - (mz_int64)sizeof(buf_u32), 0);
  for (;;) {
    int i,
        n = (int)MZ_MIN(sizeof(buf_u32), pZip->m_archive_size - cur_file_ofs);
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, n) != (mz_uint)n)
      return MZ_FALSE;
    for (i = n - 4; i >= 0; --i)
      if (MZ_READ_LE32(pBuf + i) == MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
        break;
    if (i >= 0) {
      cur_file_ofs += i;
      break;
    }
    if ((!cur_file_ofs) || ((pZip->m_archive_size - cur_file_ofs) >=
                            (0xFFFF + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)))
      return MZ_FALSE;
    cur_file_ofs = MZ_MAX(cur_file_ofs - (sizeof(buf_u32) - 3), 0);
  }
  // Read and verify the end of central directory record.
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf,
                    MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if ((MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) !=
       MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG) ||
      ((pZip->m_total_files =
            MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS)) !=
       MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS)))
    return MZ_FALSE;

  num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
  cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
  if (((num_this_disk | cdir_disk_index) != 0) &&
      ((num_this_disk != 1) || (cdir_disk_index != 1)))
    return MZ_FALSE;

  if ((cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS)) <
      pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;

  cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);
  if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
    return MZ_FALSE;

  pZip->m_central_directory_file_ofs = cdir_ofs;

  if (pZip->m_total_files) {
    mz_uint i, n;

    // Read the entire central directory into a heap block, and allocate another
    // heap block to hold the unsorted central dir file record offsets, and
    // another to hold the sorted indices.
    if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size,
                              MZ_FALSE)) ||
        (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets,
                              pZip->m_total_files, MZ_FALSE)))
      return MZ_FALSE;

    if (sort_central_dir) {
      if (!mz_zip_array_resize(pZip,
                               &pZip->m_pState->m_sorted_central_dir_offsets,
                               pZip->m_total_files, MZ_FALSE))
        return MZ_FALSE;
    }

    if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs,
                      pZip->m_pState->m_central_dir.m_p,
                      cdir_size) != cdir_size)
      return MZ_FALSE;

    // Now create an index into the central directory file records, do some
    // basic sanity checking on each record, and check for zip64 entries (which
    // are not yet supported).
    p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
    for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i) {
      mz_uint total_header_size, comp_size, decomp_size, disk_index;
      if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) ||
          (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
        return MZ_FALSE;
      MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32,
                           i) =
          (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);
      if (sort_central_dir)
        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets,
                             mz_uint32, i) = i;
      comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
      decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
      if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) &&
           (decomp_size != comp_size)) ||
          (decomp_size && !comp_size) || (decomp_size == 0xFFFFFFFF) ||
          (comp_size == 0xFFFFFFFF))
        return MZ_FALSE;
      disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
      if ((disk_index != num_this_disk) && (disk_index != 1))
        return MZ_FALSE;
      if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) +
           MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
        return MZ_FALSE;
      if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) >
          n)
        return MZ_FALSE;
      n -= total_header_size;
      p += total_header_size;
    }
  }

  if (sort_central_dir)
    mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

  return MZ_TRUE;
}